

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::resetToken(OSToken *this,ByteString *label)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference ppOVar4;
  undefined8 uVar5;
  long *in_RDI;
  OSAttribute tokenFlags;
  OSAttribute tokenLabel;
  string lockFilename;
  string objectFilename;
  ObjectFile *fileObject;
  iterator i;
  MutexLocker lock;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> cleanUp;
  CK_ULONG flags;
  Mutex *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  byte in_stack_fffffffffffffd64;
  byte in_stack_fffffffffffffd65;
  byte in_stack_fffffffffffffd66;
  byte in_stack_fffffffffffffd67;
  _Rb_tree_const_iterator<OSObject_*> *in_stack_fffffffffffffd68;
  ObjectFile *in_stack_fffffffffffffd78;
  Directory *in_stack_fffffffffffffd88;
  OSAttribute *in_stack_fffffffffffffd90;
  undefined1 local_258 [72];
  Generation *in_stack_fffffffffffffdf0;
  undefined1 local_1b8 [160];
  _Base_ptr local_118;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  uint local_8c;
  OSAttribute *local_88;
  _Self local_80;
  _Self local_78 [5];
  undefined1 local_50 [48];
  byte local_20 [2];
  byte bStack_1e;
  byte local_1;
  
  uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_20);
  if ((uVar3 & 1) == 0) {
    softHSMLog(3,"resetToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,499,"Failed to get the token attributes");
    local_1 = 0;
  }
  else {
    (**(code **)(*in_RDI + 0x40))(local_50);
    MutexLocker::MutexLocker
              ((MutexLocker *)
               CONCAT17(in_stack_fffffffffffffd67,
                        CONCAT16(in_stack_fffffffffffffd66,
                                 CONCAT15(in_stack_fffffffffffffd65,
                                          CONCAT14(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60)))),
               in_stack_fffffffffffffd58);
    local_78[0]._M_node =
         (_Base_ptr)
         std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::begin
                   ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                    in_stack_fffffffffffffd58);
    while( true ) {
      local_80._M_node =
           (_Base_ptr)
           std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::end
                     ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                      in_stack_fffffffffffffd58);
      bVar1 = std::operator!=(local_78,&local_80);
      if (!bVar1) break;
      ppOVar4 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                          ((_Rb_tree_const_iterator<OSObject_*> *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,
                                             CONCAT15(in_stack_fffffffffffffd65,
                                                      CONCAT14(in_stack_fffffffffffffd64,
                                                               in_stack_fffffffffffffd60)))));
      if (*ppOVar4 == (OSObject *)0x0) {
        in_stack_fffffffffffffd90 = (OSAttribute *)0x0;
      }
      else {
        in_stack_fffffffffffffd90 =
             (OSAttribute *)__dynamic_cast(*ppOVar4,&OSObject::typeinfo,&ObjectFile::typeinfo,0);
      }
      local_88 = in_stack_fffffffffffffd90;
      if (in_stack_fffffffffffffd90 == (OSAttribute *)0x0) {
        ppOVar4 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                            ((_Rb_tree_const_iterator<OSObject_*> *)
                             CONCAT17(in_stack_fffffffffffffd67,
                                      CONCAT16(in_stack_fffffffffffffd66,
                                               CONCAT15(in_stack_fffffffffffffd65,
                                                        CONCAT14(in_stack_fffffffffffffd64,
                                                                 in_stack_fffffffffffffd60)))));
        softHSMLog(3,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x202,"Object type not compatible with this token class 0x%08X",*ppOVar4);
        local_1 = 0;
        local_8c = 1;
        goto LAB_001e037e;
      }
      ObjectFile::invalidate((ObjectFile *)0x1dfe10);
      ObjectFile::getFilename_abi_cxx11_(in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd88 = (Directory *)in_RDI[0x1a];
      std::__cxx11::string::string(local_d0,local_b0);
      iVar2 = Directory::remove(in_stack_fffffffffffffd88,(char *)local_d0);
      std::__cxx11::string::~string(local_d0);
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        ObjectFile::getLockname_abi_cxx11_(in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd78 = (ObjectFile *)in_RDI[0x1a];
        std::__cxx11::string::string(local_110,local_f0);
        iVar2 = Directory::remove((Directory *)in_stack_fffffffffffffd78,(char *)local_110);
        std::__cxx11::string::~string(local_110);
        bVar1 = (((byte)iVar2 ^ 0xff) & 1) != 0;
        if (bVar1) {
          uVar5 = std::__cxx11::string::c_str();
          softHSMLog(3,"resetToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x21b,"Failed to delete lock file %s",uVar5);
          local_1 = 0;
        }
        else {
          in_stack_fffffffffffffd68 = (_Rb_tree_const_iterator<OSObject_*> *)(in_RDI + 6);
          std::_Rb_tree_const_iterator<OSObject_*>::operator*
                    ((_Rb_tree_const_iterator<OSObject_*> *)
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,
                                                CONCAT14(in_stack_fffffffffffffd64,
                                                         in_stack_fffffffffffffd60)))));
          std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::erase
                    ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,
                                                CONCAT14(in_stack_fffffffffffffd64,
                                                         in_stack_fffffffffffffd60)))),
                     (key_type *)in_stack_fffffffffffffd58);
          uVar5 = std::__cxx11::string::c_str();
          softHSMLog(7,"resetToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x222,"Deleted object %s",uVar5);
        }
        local_8c = (uint)bVar1;
        std::__cxx11::string::~string(local_f0);
      }
      else {
        uVar5 = std::__cxx11::string::c_str();
        softHSMLog(3,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x210,"Failed to delete object file %s",uVar5);
        local_1 = 0;
        local_8c = 1;
      }
      std::__cxx11::string::~string(local_b0);
      if (local_8c != 0) goto LAB_001e037e;
      local_118 = (_Base_ptr)
                  std::_Rb_tree_const_iterator<OSObject_*>::operator++
                            (in_stack_fffffffffffffd68,
                             CONCAT13(in_stack_fffffffffffffd67,
                                      CONCAT12(in_stack_fffffffffffffd66,
                                               CONCAT11(in_stack_fffffffffffffd65,
                                                        in_stack_fffffffffffffd64))));
    }
    local_20[0] = local_20[0] & 0xf7;
    bStack_1e = bStack_1e & 0xf0;
    OSAttribute::OSAttribute(in_stack_fffffffffffffd90,(ByteString *)in_stack_fffffffffffffd88);
    OSAttribute::OSAttribute
              ((OSAttribute *)
               CONCAT17(in_stack_fffffffffffffd67,
                        CONCAT16(in_stack_fffffffffffffd66,
                                 CONCAT15(in_stack_fffffffffffffd65,
                                          CONCAT14(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60)))),
               (unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd67 =
         (**(code **)(*(long *)in_RDI[0x18] + 0x40))((long *)in_RDI[0x18],0x80005349,local_1b8);
    if (((in_stack_fffffffffffffd67 & 1) == 0) ||
       (in_stack_fffffffffffffd66 =
             (**(code **)(*(long *)in_RDI[0x18] + 0x40))((long *)in_RDI[0x18],0x8000534b,local_258),
       (in_stack_fffffffffffffd66 & 1) == 0)) {
      softHSMLog(3,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x233,"Failed to set the token attributes");
      local_1 = 0;
    }
    else {
      in_stack_fffffffffffffd65 =
           (**(code **)(*(long *)in_RDI[0x18] + 0x10))((long *)in_RDI[0x18],0x8000534d);
      if (((in_stack_fffffffffffffd65 & 1) == 0) ||
         (in_stack_fffffffffffffd64 =
               (**(code **)(*(long *)in_RDI[0x18] + 0x48))((long *)in_RDI[0x18],0x8000534d),
         (in_stack_fffffffffffffd64 & 1) != 0)) {
        uVar5 = std::__cxx11::string::c_str();
        softHSMLog(7,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x240,"Token instance %s was succesfully reset",uVar5);
        Generation::update((Generation *)in_RDI[0x19]);
        Generation::commit(in_stack_fffffffffffffdf0);
        local_1 = 1;
      }
      else {
        softHSMLog(3,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x23b,"Failed to remove USERPIN");
        local_1 = 0;
      }
    }
    local_8c = 1;
    OSAttribute::~OSAttribute
              ((OSAttribute *)
               CONCAT17(in_stack_fffffffffffffd67,
                        CONCAT16(in_stack_fffffffffffffd66,
                                 CONCAT15(in_stack_fffffffffffffd65,
                                          CONCAT14(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60)))));
    OSAttribute::~OSAttribute
              ((OSAttribute *)
               CONCAT17(in_stack_fffffffffffffd67,
                        CONCAT16(in_stack_fffffffffffffd66,
                                 CONCAT15(in_stack_fffffffffffffd65,
                                          CONCAT14(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60)))));
LAB_001e037e:
    MutexLocker::~MutexLocker
              ((MutexLocker *)
               CONCAT17(in_stack_fffffffffffffd67,
                        CONCAT16(in_stack_fffffffffffffd66,
                                 CONCAT15(in_stack_fffffffffffffd65,
                                          CONCAT14(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60)))));
    std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
              ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1e0398);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSToken::resetToken(const ByteString& label)
{
	CK_ULONG flags;

	if (!getTokenFlags(flags))
	{
		ERROR_MSG("Failed to get the token attributes");

		return false;
	}

	// Clean up
	std::set<OSObject*> cleanUp = getObjects();

	MutexLocker lock(tokenMutex);

	for (std::set<OSObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>(*i);
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", *i);

			return false;
		}

		// Invalidate the object instance
		fileObject->invalidate();

		// Retrieve the filename of the object
		std::string objectFilename = fileObject->getFilename();

		// Attempt to delete the file
		if (!tokenDir->remove(objectFilename))
		{
			ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

			return false;
		}

		// Retrieve the filename of the lock
		std::string lockFilename = fileObject->getLockname();

		// Attempt to delete the lock
		if (!tokenDir->remove(lockFilename))
		{
			ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

			return false;
		}

		objects.erase(*i);

		DEBUG_MSG("Deleted object %s", objectFilename.c_str());
	}

	// The user PIN has been removed
	flags &= ~CKF_USER_PIN_INITIALIZED;
	flags &= ~CKF_USER_PIN_COUNT_LOW;
	flags &= ~CKF_USER_PIN_FINAL_TRY;
	flags &= ~CKF_USER_PIN_LOCKED;
	flags &= ~CKF_USER_PIN_TO_BE_CHANGED;

	// Set new token attributes
	OSAttribute tokenLabel(label);
	OSAttribute tokenFlags(flags);

	if (!tokenObject->setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject->setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_USERPIN) &&
	    !tokenObject->deleteAttribute(CKA_OS_USERPIN))
	{
		ERROR_MSG("Failed to remove USERPIN");

		return false;
	}

	DEBUG_MSG("Token instance %s was succesfully reset", tokenPath.c_str());

	gen->update();
	gen->commit();

	return true;
}